

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_unit.cc
# Opt level: O2

uintmax_t __thiscall pstack::Dwarf::Unit::rnglistx(Unit *this,size_t slot)

{
  uintmax_t uVar1;
  uintmax_t uVar2;
  pair<unsigned_long,_unsigned_long> pVar3;
  DWARFReader local_c8;
  DIE local_a0;
  undefined1 local_78 [8];
  Attribute attr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  Elf::Section::io((Section *)&attr.formp);
  local_c8.off = 0;
  local_c8.end = (**(code **)(*(long *)attr.formp + 0x40))();
  local_c8.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)attr.formp;
  local_c8.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = a_Stack_40[0]._M_pi;
  attr.formp = (FormEntry *)0x0;
  a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_c8.addrLen = 8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_40);
  root(&local_a0,this);
  DIE::attribute((Attribute *)local_78,&local_a0,DW_AT_rnglists_base,false);
  DIE::~DIE(&local_a0);
  if (attr.die.unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = DIE::Attribute::operator_cast_to_unsigned_long((Attribute *)local_78);
  }
  pVar3 = DWARFReader::getlength(&local_c8);
  DWARFReader::setOffset(&local_c8,slot * pVar3.second + uVar1);
  uVar2 = DWARFReader::getuint(&local_c8,pVar3.second);
  DIE::~DIE((DIE *)local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c8.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return uVar2 + uVar1;
}

Assistant:

uintmax_t
Unit::rnglistx(size_t slot) {

    DWARFReader r(dwarf->debugRangelists.io(), 0);
    auto attr = root().attribute(DW_AT_rnglists_base);
    auto base = attr.valid() ? uintmax_t(attr) : 0;

    // We need to parse the first part of the header to get the size of the
    // entries in the table.
    auto [ _, dwarflen ] = r.getlength();
    /*
     * We don't need the rest of the fields:
    auto version = r.getuint(2);
    auto address_size = r.getuint(1);
    auto ss_size = r.getuint(1);
    auto offset_entry_count = r.getuint(4);
    */

    // seek to the entry at base + slot ...
    r.setOffset(base + slot * dwarflen);

    // ...then read and add the base.
    return base + r.getuint(dwarflen);
}